

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstrformat.cpp
# Opt level: O3

int myvsnprintf_helper(void *data,char *cstr,int cstr_len)

{
  long lVar1;
  int iVar2;
  
  iVar2 = *(int *)((long)data + 0x18) + cstr_len;
  if ((int)(cstr_len ^ 0x7fffffffU) < *(int *)((long)data + 0x18)) {
    iVar2 = 0x7fffffff;
  }
  *(int *)((long)data + 0x18) = iVar2;
  lVar1 = *(long *)((long)data + 0x10);
  if (*(ulong *)((long)data + 8) < (ulong)(lVar1 + cstr_len)) {
    cstr_len = (int)*(ulong *)((long)data + 8) - (int)lVar1;
  }
  if (0 < cstr_len) {
    memcpy((void *)(lVar1 + *data),cstr,(ulong)(uint)cstr_len);
    *(long *)((long)data + 0x10) = *(long *)((long)data + 0x10) + (ulong)(uint)cstr_len;
  }
  return cstr_len;
}

Assistant:

static int myvsnprintf_helper(void *data, const char *cstr, int cstr_len)
{
	snprintf_state *state = (snprintf_state *)data;

	if (INT_MAX - cstr_len < state->ideallen)
	{
		state->ideallen = INT_MAX;
	}
	else
	{
		state->ideallen += cstr_len;
	}
	if (state->curlen + cstr_len > state->maxlen)
	{
		cstr_len = (int)(state->maxlen - state->curlen);
	}
	if (cstr_len > 0)
	{
		memcpy(state->buffer + state->curlen, cstr, cstr_len);
		state->curlen += cstr_len;
	}
	return cstr_len;
}